

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<std::vector<(anonymous_namespace)::ns::Employee_NCGN,std::allocator<(anonymous_namespace)::ns::Employee_NCGN>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  bool bVar1;
  _Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  *this_00;
  pointer __result;
  iterator this_01;
  conv_error *this_02;
  error_category *peVar2;
  _Tp_alloc_type *in_RCX;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *__n;
  error_code ec;
  const_array_range_type cVar3;
  type local_60;
  
  __n = this;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar1) {
    this_02 = (conv_error *)__cxa_allocate_exception(0x58);
    peVar2 = conv_error_category();
    ec._M_cat = peVar2;
    ec._0_8_ = 4;
    conv_error::conv_error(this_02,ec);
    __cxa_throw(this_02,&conv_error::typeinfo,conv_error::~conv_error);
  }
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
             *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if ((ulong)this_00 >> 0x39 == 0) {
    if (this_00 !=
        (_Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
         *)0x0) {
      __result = std::
                 _Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
                 ::_M_allocate(this_00,(size_t)__n);
      std::
      vector<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      ::_S_relocate((pointer)0x0,(pointer)0x0,__result,in_RCX);
      (__return_storage_ptr__->
      super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      )._M_impl.super__Vector_impl_data._M_start = __result;
      (__return_storage_ptr__->
      super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      )._M_impl.super__Vector_impl_data._M_finish = __result;
      (__return_storage_ptr__->
      super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
    }
    cVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    for (this_01 = cVar3.first_._M_current; this_01._M_current != cVar3.last_._M_current._M_current;
        this_01._M_current = this_01._M_current + 1) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
      as<(anonymous_namespace)::ns::Employee_NCGN>(&local_60,this_01._M_current);
      std::
      vector<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      ::push_back(__return_storage_ptr__,&local_60);
      anon_unknown.dwarf_4574528::ns::Employee_NCGN::~Employee_NCGN(&local_60);
    }
    return __return_storage_ptr__;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }